

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_graph_expansion_unit_test.cpp
# Opt level: O0

void __thiscall
simplex_tree_expansion_with_blockers_2<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
::test_method(simplex_tree_expansion_with_blockers_2<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
              *this)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  type_conflict3 tVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  Filtration_simplex_range *this_00;
  reference other;
  lazy_ostream *plVar8;
  Filtration_value *pFVar9;
  double dVar10;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  SVar11;
  basic_cstring<const_char> local_680;
  basic_cstring<const_char> local_670;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_660;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_640;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 *local_628;
  undefined8 local_620;
  undefined1 local_618 [32];
  basic_cstring<const_char> local_5f8;
  basic_cstring<const_char> local_5e8;
  undefined4 local_5d4;
  Vertex_handle local_5d0;
  undefined4 local_5cc;
  size_holder<true,_unsigned_long,_void> local_5c8;
  node_ptr local_5c0;
  undefined1 local_5b8 [40];
  undefined1 local_590 [16];
  Vertex_handle local_580;
  undefined4 local_57c;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>
  *local_578;
  undefined1 local_570 [20];
  undefined1 local_55c [20];
  pointer local_548;
  undefined1 local_540 [24];
  basic_cstring<const_char> local_528;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_518;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_4f8;
  undefined1 local_4ec [28];
  undefined1 local_4d0 [32];
  basic_cstring<const_char> local_4b0;
  basic_cstring<const_char> local_4a0;
  basic_cstring<const_char> local_490;
  basic_cstring<const_char> local_480;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_470;
  assertion_result local_450;
  basic_cstring<const_char> local_438;
  basic_cstring<const_char> local_428;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3f8;
  assertion_result local_3d8;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  int local_39c;
  Siblings *pSStack_398;
  int vertex;
  Vertex_handle local_390;
  Siblings *local_388;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  __end0_1;
  Siblings *local_368;
  Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  __begin0_1;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
  local_350;
  iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
  *local_330;
  Simplex_vertex_range *__range2;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_320;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  f_simplex;
  const_iterator __end0;
  const_iterator __begin0;
  Filtration_simplex_range *__range1;
  undefined1 local_2f0 [32];
  undefined4 *local_2d0;
  size_t local_2c8;
  undefined1 local_2c0 [32];
  size_holder<true,_unsigned_long,_void> local_2a0;
  node_ptr local_298;
  undefined1 local_290 [32];
  size_holder<true,_unsigned_long,_void> local_270;
  node_ptr local_268;
  undefined1 local_260 [32];
  size_holder<true,_unsigned_long,_void> local_240;
  node_ptr local_238;
  undefined1 local_230 [32];
  size_holder<true,_unsigned_long,_void> local_210;
  node_ptr local_208;
  undefined1 local_200 [32];
  size_holder<true,_unsigned_long,_void> local_1e0;
  node_ptr local_1d8;
  undefined1 local_1d0 [32];
  size_holder<true,_unsigned_long,_void> local_1b0;
  node_ptr local_1a8;
  undefined1 local_1a0 [32];
  size_holder<true,_unsigned_long,_void> local_180;
  node_ptr local_178;
  undefined1 local_170 [32];
  size_holder<true,_unsigned_long,_void> local_150;
  node_ptr local_148;
  undefined1 local_140 [32];
  size_holder<true,_unsigned_long,_void> local_120;
  node_ptr local_118;
  undefined1 local_110 [32];
  size_holder<true,_unsigned_long,_void> local_f0;
  node_ptr local_e8;
  undefined1 local_d0 [28];
  undefined4 local_b4;
  node_ptr local_b0;
  node_ptr local_a8;
  undefined1 local_a0 [8];
  Simplex_tree<Gudhi::Simplex_tree_options_full_featured> simplex_tree;
  simplex_tree_expansion_with_blockers_2<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
  *this_local;
  
  simplex_tree._136_8_ = this;
  std::operator<<((ostream *)&std::clog,
                  "********************************************************************\n");
  std::operator<<((ostream *)&std::clog,"simplex_tree_expansion_with_blockers_2\n");
  std::operator<<((ostream *)&std::clog,
                  "********************************************************************\n");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_a0);
  local_d0._24_4_ = 0;
  local_b4._0_1_ = true;
  local_b4._1_3_ = 0;
  local_b0 = (node_ptr)(local_d0 + 0x18);
  local_a8 = (node_ptr)0x2;
  local_d0._16_8_ = (_Hash_node_base *)0x0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_d0,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_b0);
  local_110._24_4_ = 0;
  local_110._28_4_ = 2;
  local_f0.size_ = (unsigned_long)(local_110 + 0x18);
  local_e8 = (node_ptr)0x2;
  local_110._16_8_ = (_Hash_node_base *)0x3ff0000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_110,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_f0);
  local_140._24_4_ = 0;
  local_140._28_4_ = 3;
  local_120.size_ = (unsigned_long)(local_140 + 0x18);
  local_118 = (node_ptr)0x2;
  local_140._16_8_ = (_Hash_node_base *)0x4000000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_140,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_120);
  local_170._24_4_ = 1;
  local_170._28_4_ = 2;
  local_150.size_ = (unsigned_long)(local_170 + 0x18);
  local_148 = (node_ptr)0x2;
  local_170._16_8_ = (_Hash_node_base *)0x4008000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_170,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_150);
  local_1a0._24_4_ = 1;
  local_1a0._28_4_ = 3;
  local_180.size_ = (unsigned_long)(local_1a0 + 0x18);
  local_178 = (node_ptr)0x2;
  local_1a0._16_8_ = (_Hash_node_base *)0x4010000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_1a0,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_180);
  local_1d0._24_4_ = 2;
  local_1d0._28_4_ = 3;
  local_1b0.size_ = (unsigned_long)(local_1d0 + 0x18);
  local_1a8 = (node_ptr)0x2;
  local_1d0._16_8_ = (_Hash_node_base *)0x4014000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_1d0,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_1b0);
  local_200._24_4_ = 2;
  local_200._28_4_ = 4;
  local_1e0.size_ = (unsigned_long)(local_200 + 0x18);
  local_1d8 = (node_ptr)0x2;
  local_200._16_8_ = (_Hash_node_base *)0x4018000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_200,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_1e0);
  local_230._24_4_ = 3;
  local_230._28_4_ = 6;
  local_210.size_ = (unsigned_long)(local_230 + 0x18);
  local_208 = (node_ptr)0x2;
  local_230._16_8_ = (_Hash_node_base *)0x401c000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_230,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_210);
  local_260._24_4_ = 4;
  local_260._28_4_ = 5;
  local_240.size_ = (unsigned_long)(local_260 + 0x18);
  local_238 = (node_ptr)0x2;
  local_260._16_8_ = (_Hash_node_base *)0x4020000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_260,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_240);
  local_290._24_4_ = 4;
  local_290._28_4_ = 6;
  local_270.size_ = (unsigned_long)(local_290 + 0x18);
  local_268 = (node_ptr)0x2;
  local_290._16_8_ = (_Hash_node_base *)0x4022000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_290,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_270);
  local_2c0._24_4_ = 5;
  local_2c0._28_4_ = 6;
  local_2a0.size_ = (unsigned_long)(local_2c0 + 0x18);
  local_298 = (node_ptr)0x2;
  local_2c0._16_8_ = (_Hash_node_base *)0x4024000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_2c0,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_2a0);
  local_2f0._28_4_ = 6;
  local_2d0 = (undefined4 *)(local_2f0 + 0x1c);
  local_2c8 = 1;
  local_2f0._16_8_ = (_Hash_node_base *)0x4024000000000000;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  insert_simplex<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_2f0,
             (initializer_list<int> *)local_a0,(Filtration_value *)&local_2d0);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::
  expansion_with_blockers<simplex_tree_expansion_with_blockers_2<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>::test_method()::_lambda(boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>)_1_>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_a0,2,
             (anon_class_8_1_0c67b935)local_a0);
  poVar6 = std::operator<<((ostream *)&std::clog,"* The complex contains ");
  sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::num_simplices
                    ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_a0);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar7);
  std::operator<<(poVar6," simplices");
  poVar6 = std::operator<<((ostream *)&std::clog," - dimension ");
  iVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::dimension
                    ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_a0);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
  std::operator<<(poVar6,"\n");
  std::operator<<((ostream *)&std::clog,
                  "* Iterator on Simplices in the filtration, with [filtration value]:\n");
  this_00 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::filtration_simplex_range
                      ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_a0);
  __end0 = std::
           vector<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>
           ::begin(this_00);
  f_simplex.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )std::
         vector<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>
         ::end(this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_*,_std::vector<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>_>
                                     *)&f_simplex), bVar3) {
    other = __gnu_cxx::
            __normal_iterator<const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_*,_std::vector<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>_>
            ::operator*(&__end0);
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::iterator_from_iiterator(&local_320,other);
    poVar6 = std::operator<<((ostream *)&std::clog,"   ");
    poVar6 = std::operator<<(poVar6,"[");
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::iterator_from_iiterator
              ((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
                *)&__range2,&local_320);
    pFVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::filtration
                       ((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
                         *)&__range2);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pFVar9);
    std::operator<<(poVar6,"] ");
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::iterator_from_iiterator
              ((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
                *)&__begin0_1.v_,&local_320);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::simplex_vertex_range
              ((Simplex_vertex_range *)&local_350,
               (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_a0,
               (Simplex_handle *)&__begin0_1.v_);
    local_330 = &local_350;
    SVar11 = boost::iterator_range_detail::
             iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
             ::begin(local_330);
    __end0_1._8_8_ = SVar11.sib_;
    __begin0_1.sib_._0_4_ = SVar11.v_;
    local_368 = (Siblings *)__end0_1._8_8_;
    SVar11 = boost::iterator_range_detail::
             iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_boost::iterators::incrementable_traversal_tag>
             ::end(local_330);
    pSStack_398 = SVar11.sib_;
    local_390 = SVar11.v_;
    local_388 = pSStack_398;
    __end0_1.sib_._0_4_ = local_390;
    while (tVar4 = boost::iterators::operator!=
                             ((iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                               *)&local_368,
                              (iterator_facade<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long>
                               *)&local_388), tVar4) {
      local_39c = boost::iterators::detail::
                  iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                  ::operator*((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                               *)&local_368);
      poVar6 = std::operator<<((ostream *)&std::clog,"(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_39c);
      std::operator<<(poVar6,")");
      boost::iterators::detail::
      iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
      ::operator++((iterator_facade_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_const_int,_boost::iterators::forward_traversal_tag,_const_int,_long,_false,_false>
                    *)&local_368);
    }
    std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_*,_std::vector<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>_>
    ::operator++(&__end0);
  }
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
               ,0x86);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_3b0,0xc4,&local_3c0);
    sVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::num_simplices
                      ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_a0);
    boost::test_tools::assertion_result::assertion_result(&local_3d8,sVar7 == 0x16);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,"simplex_tree.num_simplices() == 22",0x22);
    boost::unit_test::operator<<(&local_3f8,plVar8,&local_408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
               ,0x86);
    boost::test_tools::tt_detail::report_assertion(&local_3d8,&local_3f8,&local_418,0xc4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3f8);
    boost::test_tools::assertion_result::~assertion_result(&local_3d8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
               ,0x86);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_438);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_428,0xc5,&local_438);
    iVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::dimension
                      ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_a0);
    boost::test_tools::assertion_result::assertion_result(&local_450,iVar5 == 2);
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_480,"simplex_tree.dimension() == 2",0x1d);
    boost::unit_test::operator<<(&local_470,plVar8,&local_480);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_490,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
               ,0x86);
    boost::test_tools::tt_detail::report_assertion(&local_450,&local_470,&local_490,0xc5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_470);
    boost::test_tools::assertion_result::~assertion_result(&local_450);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
               ,0x86);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_4a0,199,&local_4b0);
    local_4ec._0_4_ = 4;
    local_4ec._4_4_ = 5;
    local_4ec._8_4_ = 6;
    local_4ec._12_8_ = local_4ec;
    local_4ec._20_8_ = (node_ptr)0x3;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::find<std::initializer_list<int>>
              ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_4d0,
               (initializer_list<int> *)local_a0);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::null_simplex();
    bVar3 = boost::container::dtl::operator==
                      ((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
                        *)local_4d0,&local_4f8);
    boost::test_tools::assertion_result::assertion_result((assertion_result *)(local_4d0 + 8),bVar3)
    ;
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_528,"simplex_tree.find({4, 5, 6}) == simplex_tree.null_simplex()",0x3b);
    boost::unit_test::operator<<(&local_518,plVar8,&local_528);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_540 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
               ,0x86);
    boost::test_tools::tt_detail::report_assertion(local_4d0 + 8,&local_518,local_540 + 8,199,1,0,0)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_518);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)(local_4d0 + 8));
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  local_55c._0_4_ = 0;
  local_55c._4_4_ = 1;
  local_55c._8_4_ = 2;
  local_55c._12_8_ = local_55c;
  local_548 = (pointer)0x3;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::find<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_540,
             (initializer_list<int> *)local_a0);
  pFVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::filtration
                     ((Simplex_handle *)local_540);
  dVar1 = *pFVar9;
  dVar10 = std::numeric_limits<double>::epsilon();
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,4.0,dVar10);
  local_590._12_4_ = 0;
  local_580 = 1;
  local_57c = 3;
  local_578 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>
               *)(local_590 + 0xc);
  local_570._0_8_ = 3;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::find<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)(local_570 + 8),
             (initializer_list<int> *)local_a0);
  pFVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::filtration
                     ((Simplex_handle *)(local_570 + 8));
  dVar1 = *pFVar9;
  dVar10 = std::numeric_limits<double>::epsilon();
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,5.0,dVar10);
  local_5b8._12_4_ = 0;
  local_5b8._16_4_ = 2;
  local_5b8._20_4_ = 3;
  local_5b8._24_8_ = local_5b8 + 0xc;
  local_5b8._32_8_ = (pointer)0x3;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::find<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_590,
             (initializer_list<int> *)local_a0);
  pFVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::filtration
                     ((Simplex_handle *)local_590);
  dVar1 = *pFVar9;
  dVar10 = std::numeric_limits<double>::epsilon();
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,6.0,dVar10);
  local_5d4 = 1;
  local_5d0 = 2;
  local_5cc = 3;
  local_5c8.size_ = (unsigned_long)&local_5d4;
  local_5c0 = (node_ptr)0x3;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::find<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_5b8,
             (initializer_list<int> *)local_a0);
  pFVar9 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::filtration
                     ((Simplex_handle *)local_5b8);
  dVar1 = *pFVar9;
  dVar10 = std::numeric_limits<double>::epsilon();
  GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>(dVar1,6.0,dVar10);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
               ,0x86);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_5e8,0xd0,&local_5f8);
    local_638 = 0;
    local_634 = 1;
    local_630 = 2;
    local_62c = 3;
    local_628 = &local_638;
    local_620 = 4;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::find<std::initializer_list<int>>
              ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_618,
               (initializer_list<int> *)local_a0);
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::null_simplex();
    bVar3 = boost::container::dtl::operator==
                      ((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
                        *)local_618,&local_640);
    boost::test_tools::assertion_result::assertion_result((assertion_result *)(local_618 + 8),bVar3)
    ;
    plVar8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_670,"simplex_tree.find({0,1,2,3}) == simplex_tree.null_simplex()",0x3b);
    boost::unit_test::operator<<(&local_660,plVar8,&local_670);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_680,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_graph_expansion_unit_test.cpp"
               ,0x86);
    boost::test_tools::tt_detail::report_assertion(local_618 + 8,&local_660,&local_680,0xd0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_660);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)(local_618 + 8));
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::~Simplex_tree
            ((Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)local_a0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(simplex_tree_expansion_with_blockers_2, typeST, list_of_tested_variants) {
  std::clog << "********************************************************************\n";
  std::clog << "simplex_tree_expansion_with_blockers_2\n";
  std::clog << "********************************************************************\n";
  using Simplex_handle = typename typeST::Simplex_handle;
  // Construct the Simplex Tree with a 1-skeleton graph example
  typeST simplex_tree;

  simplex_tree.insert_simplex({0, 1}, 0.);
  simplex_tree.insert_simplex({0, 2}, 1.);
  simplex_tree.insert_simplex({0, 3}, 2.);
  simplex_tree.insert_simplex({1, 2}, 3.);
  simplex_tree.insert_simplex({1, 3}, 4.);
  simplex_tree.insert_simplex({2, 3}, 5.);
  simplex_tree.insert_simplex({2, 4}, 6.);
  simplex_tree.insert_simplex({3, 6}, 7.);
  simplex_tree.insert_simplex({4, 5}, 8.);
  simplex_tree.insert_simplex({4, 6}, 9.);
  simplex_tree.insert_simplex({5, 6}, 10.);
  simplex_tree.insert_simplex({6}, 10.);

  simplex_tree.expansion_with_blockers(2, [&](Simplex_handle sh){
      bool result = false;
      std::clog << "Blocker on [";
      // User can loop on the vertices from the given simplex_handle i.e.
      for (auto vertex : simplex_tree.simplex_vertex_range(sh)) {
        // We block the expansion, if the vertex '6' is in the given list of vertices
        if (vertex == 6)
          result = true;
        std::clog << vertex << ", ";
      }
      std::clog << "] ( " << simplex_tree.filtration(sh);
      // User can re-assign a new filtration value directly in the blocker (default is the maximal value of boundaries)
      simplex_tree.assign_filtration(sh, simplex_tree.filtration(sh) + 1.);

      std::clog << " + 1. ) = " << result << std::endl;

      return result;
    });

  std::clog << "* The complex contains " << simplex_tree.num_simplices() << " simplices";
  std::clog << " - dimension " << simplex_tree.dimension() << "\n";
  std::clog << "* Iterator on Simplices in the filtration, with [filtration value]:\n";
  for (auto f_simplex : simplex_tree.filtration_simplex_range()) {
    std::clog << "   " << "[" << simplex_tree.filtration(f_simplex) << "] ";
    for (auto vertex : simplex_tree.simplex_vertex_range(f_simplex))
      std::clog << "(" << vertex << ")";
    std::clog << std::endl;
  }

  BOOST_CHECK(simplex_tree.num_simplices() == 22);
  BOOST_CHECK(simplex_tree.dimension() == 2);
  // {4, 5, 6} shall be blocked
  BOOST_CHECK(simplex_tree.find({4, 5, 6}) == simplex_tree.null_simplex());
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(simplex_tree.filtration(simplex_tree.find({0,1,2})),
                                                          static_cast<typename typeST::Filtration_value>(4.));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(simplex_tree.filtration(simplex_tree.find({0,1,3})),
                                                          static_cast<typename typeST::Filtration_value>(5.));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(simplex_tree.filtration(simplex_tree.find({0,2,3})),
                                                          static_cast<typename typeST::Filtration_value>(6.));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(simplex_tree.filtration(simplex_tree.find({1,2,3})),
                                                          static_cast<typename typeST::Filtration_value>(6.));
  BOOST_CHECK(simplex_tree.find({0,1,2,3}) == simplex_tree.null_simplex());
}